

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DMHighLevelEncoder.cpp
# Opt level: O2

int ZXing::DataMatrix::DMTextEncoder::EncodeChar(int c,string *sb)

{
  char cVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  bool bVar5;
  
  iVar3 = 0;
  iVar2 = 0;
  uVar4 = c;
  do {
    cVar1 = (char)sb;
    if (((c + iVar3 == 0x20) || (uVar4 - 0x30 < 10)) || (uVar4 - 0x61 < 0x1a)) {
      iVar3 = 1;
LAB_0016b9c1:
      std::__cxx11::string::push_back(cVar1);
      return iVar3 - iVar2;
    }
    if (uVar4 < 0x20) {
      std::__cxx11::string::push_back(cVar1);
      iVar3 = 2;
      goto LAB_0016b9c1;
    }
    if ((int)uVar4 < 0x30) {
      std::__cxx11::string::push_back(cVar1);
LAB_0016b9be:
      iVar3 = 2;
      goto LAB_0016b9c1;
    }
    if (uVar4 < 0x41) {
      std::__cxx11::string::push_back(cVar1);
      goto LAB_0016b9be;
    }
    if (uVar4 - 0x5b < 5) {
      std::__cxx11::string::push_back(cVar1);
      goto LAB_0016b9be;
    }
    if (uVar4 == 0x60) {
      iVar3 = 2;
      std::__cxx11::string::push_back(cVar1);
      goto LAB_0016b9c1;
    }
    if (uVar4 < 0x5b) {
      std::__cxx11::string::push_back(cVar1);
      goto LAB_0016b9be;
    }
    bVar5 = uVar4 < 0x80;
    uVar4 = uVar4 - 0x80;
    if (bVar5) {
      std::__cxx11::string::push_back(cVar1);
      goto LAB_0016b9be;
    }
    std::__cxx11::string::append((char *)sb);
    iVar2 = iVar2 + -2;
    iVar3 = iVar3 + -0x80;
  } while( true );
}

Assistant:

static int EncodeChar(int c, std::string& sb)
	{
		if (c == ' ') {
			sb.push_back('\3');
			return 1;
		}
		if (c >= '0' && c <= '9') {
			sb.push_back((char)(c - 48 + 4));
			return 1;
		}
		if (c >= 'a' && c <= 'z') {
			sb.push_back((char)(c - 97 + 14));
			return 1;
		}
		if (c >= '\0' && c <= '\x1f') {
			sb.push_back('\0'); //Shift 1 Set
			sb.push_back(c);
			return 2;
		}
		if (c <= '/') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 33));
			return 2;
		}
		if (c <= '@') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 58 + 15));
			return 2;
		}
		if (c >= '[' && c <= '_') {
			sb.push_back('\1'); //Shift 2 Set
			sb.push_back((char)(c - 91 + 22));
			return 2;
		}
		if (c == '\x60') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 96));
			return 2;
		}
		if (c <= 'Z') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 65 + 1));
			return 2;
		}
		if (c <= '\x7f') {
			sb.push_back('\2'); //Shift 3 Set
			sb.push_back((char)(c - 123 + 27));
			return 2;
		}
		sb.append("\1\x1e"); //Shift 2, Upper Shift
		int len = 2;
		len += EncodeChar(c - 128, sb);
		return len;
	}